

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O0

void duckdb_lz4::LZ4_putIndexOnHash(U32 idx,U32 h,void *tableBase,tableType_t tableType)

{
  U16 *hashTable_1;
  U32 *hashTable;
  tableType_t tableType_local;
  void *tableBase_local;
  U32 h_local;
  U32 idx_local;
  
  if (byPtr < tableType) {
    if (tableType == byU32) {
      *(U32 *)((long)tableBase + (ulong)h * 4) = idx;
    }
    else if (tableType == byU16) {
      *(short *)((long)tableBase + (ulong)h * 2) = (short)idx;
    }
  }
  return;
}

Assistant:

LZ4_FORCE_INLINE void LZ4_putIndexOnHash(U32 idx, U32 h, void* tableBase, tableType_t const tableType)
{
    switch (tableType)
    {
    default: /* fallthrough */
    case clearedTable: /* fallthrough */
    case byPtr: { /* illegal! */ assert(0); return; }
    case byU32: { U32* hashTable = (U32*) tableBase; hashTable[h] = idx; return; }
    case byU16: { U16* hashTable = (U16*) tableBase; assert(idx < 65536); hashTable[h] = (U16)idx; return; }
    }
}